

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

void GC::ResetGC(void)

{
  FastVector<char_*,_false,_false>::reset((FastVector<char_*,_false,_false> *)rootsA);
  FastVector<char_*,_false,_false>::reset((FastVector<char_*,_false,_false> *)rootsB);
  HashMap<int>::reset((HashMap<int> *)functionIDs);
  return;
}

Assistant:

void GC::ResetGC()
{
	GC::rootsA.reset();
	GC::rootsB.reset();

	GC::functionIDs.reset();
}